

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O2

void init_grid(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != 0x32; lVar2 = lVar2 + 1) {
    dVar8 = (double)((int)lVar2 + -0x19);
    iVar5 = -0x19;
    for (lVar4 = 0; lVar4 != 20000; lVar4 = lVar4 + 400) {
      dVar7 = SQRT((double)iVar5 * (double)iVar5 + dVar8 * dVar8);
      dVar6 = 0.0;
      if (dVar7 < 2.5) {
        dVar6 = cos(dVar7 * 10.0 * 0.015707963267948967);
        dVar6 = dVar6 * -100.0;
      }
      lVar1 = lVar3 + lVar4;
      *(undefined8 *)((long)vx[0] + lVar1) = 0;
      *(undefined8 *)((long)vy[0] + lVar1) = 0;
      *(double *)((long)p[0] + lVar1) = dVar6;
      iVar5 = iVar5 + 1;
    }
    lVar3 = lVar3 + 8;
  }
  return;
}

Assistant:

void init_grid(void)
{
    int x, y;
    double dx, dy, d;

    for (y = 0; y < GRIDH;  y++)
    {
        for (x = 0; x < GRIDW;  x++)
        {
            dx = (double) (x - GRIDW / 2);
            dy = (double) (y - GRIDH / 2);
            d = sqrt(dx * dx + dy * dy);
            if (d < 0.1 * (double) (GRIDW / 2))
            {
                d = d * 10.0;
                p[x][y] = -cos(d * (M_PI / (double)(GRIDW * 4))) * 100.0;
            }
            else
                p[x][y] = 0.0;

            vx[x][y] = 0.0;
            vy[x][y] = 0.0;
        }
    }
}